

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ModportSubroutinePortListSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ModportSubroutinePortListSyntax *this,
          size_t index)

{
  Token token;
  SyntaxNode *local_60;
  SyntaxNode *local_50;
  size_t index_local;
  ModportSubroutinePortListSyntax *this_local;
  
  if (index == 0) {
    local_50 = (SyntaxNode *)0x0;
    if (this != (ModportSubroutinePortListSyntax *)0xfffffffffffffff0) {
      local_50 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_50);
  }
  else if (index == 1) {
    token.kind = (this->importExport).kind;
    token._2_1_ = (this->importExport).field_0x2;
    token.numFlags.raw = (this->importExport).numFlags.raw;
    token.rawLen = (this->importExport).rawLen;
    token.info = (this->importExport).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 2) {
    local_60 = (SyntaxNode *)0x0;
    if (this != (ModportSubroutinePortListSyntax *)0xffffffffffffffb0) {
      local_60 = &(this->ports).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_60);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ModportSubroutinePortListSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return importExport;
        case 2: return &ports;
        default: return nullptr;
    }
}